

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KrazyMeans.cpp
# Opt level: O3

void __thiscall KrazyMeans::printState(KrazyMeans *this,ostream *labels_out,ostream *centroids_out)

{
  element_type *peVar1;
  ostream *poVar2;
  long lVar3;
  ulong uVar4;
  string local_58;
  ostream *local_38;
  
  peVar1 = (this->data_set).super___shared_ptr<DataSet,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_38 = centroids_out;
  if (*(pointer *)
       ((long)&(peVar1->vectors).super__Vector_base<FeatureVec,_std::allocator<FeatureVec>_>._M_impl
               .super__Vector_impl_data + 8) !=
      (peVar1->vectors).super__Vector_base<FeatureVec,_std::allocator<FeatureVec>_>._M_impl.
      super__Vector_impl_data._M_start) {
    lVar3 = 0;
    uVar4 = 0;
    do {
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)labels_out);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,", ",2);
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,", ",2);
      FeatureVec::toString_abi_cxx11_
                (&local_58,
                 (FeatureVec *)
                 ((long)(((this->data_set).super___shared_ptr<DataSet,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->vectors).
                        super__Vector_base<FeatureVec,_std::allocator<FeatureVec>_>._M_impl.
                        super__Vector_impl_data._M_start + lVar3));
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar2,local_58._M_dataplus._M_p,local_58._M_string_length);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
      std::ostream::put((char)poVar2);
      std::ostream::flush();
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p);
      }
      uVar4 = uVar4 + 1;
      peVar1 = (this->data_set).super___shared_ptr<DataSet,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      lVar3 = lVar3 + 0x18;
    } while (uVar4 < (ulong)(((long)*(pointer *)
                                     ((long)&(peVar1->vectors).
                                             super__Vector_base<FeatureVec,_std::allocator<FeatureVec>_>
                                             ._M_impl.super__Vector_impl_data + 8) -
                              (long)(peVar1->vectors).
                                    super__Vector_base<FeatureVec,_std::allocator<FeatureVec>_>.
                                    _M_impl.super__Vector_impl_data._M_start >> 3) *
                            -0x5555555555555555));
  }
  if (this->num_clusters != 0) {
    lVar3 = 0;
    uVar4 = 0;
    do {
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)local_38);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,", ",2);
      FeatureVec::toString_abi_cxx11_
                (&local_58,
                 (FeatureVec *)
                 ((long)&(((this->centroids).
                           super__Vector_base<FeatureVec,_std::allocator<FeatureVec>_>._M_impl.
                           super__Vector_impl_data._M_start)->values).
                         super__Vector_base<float,_std::allocator<float>_>._M_impl + lVar3));
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar2,local_58._M_dataplus._M_p,local_58._M_string_length);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
      std::ostream::put((char)poVar2);
      std::ostream::flush();
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p);
      }
      uVar4 = uVar4 + 1;
      lVar3 = lVar3 + 0x18;
    } while (uVar4 < this->num_clusters);
  }
  return;
}

Assistant:

void KrazyMeans::printState(std::ostream &labels_out, std::ostream &centroids_out) {
  // Print labels for all vectors
  for (size_t v = 0; v < data_set->size(); v++) {
    labels_out << v << ", " << labels[v] << ", " << data_set->vector(v).toString() << std::endl;
  }

  // Print centroids
  for (size_t c = 0; c < num_clusters; c++) {
    centroids_out << c << ", " << centroids[c].toString() << std::endl;
  }
}